

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 roundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,uint64_t zSig2,
                   float_status *status)

{
  char cVar1;
  uint64_t uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  bool bVar7;
  float128 fVar8;
  
  uVar4 = (ulong)(uint)zExp;
  cVar1 = status->float_rounding_mode;
  switch(cVar1) {
  case '\0':
  case '\x04':
    bVar6 = (byte)(zSig2 >> 0x3f);
    goto LAB_00d05b89;
  case '\x01':
    bVar7 = zSign != '\0';
    break;
  case '\x02':
    bVar7 = zSign == '\0';
    break;
  case '\x03':
    bVar6 = 0;
    goto LAB_00d05b89;
  case '\x05':
    bVar7 = (zSig1 & 1) == 0;
    break;
  default:
    goto switchD_00d05b5c_default;
  }
  bVar6 = zSig2 != 0 & bVar7;
LAB_00d05b89:
  if ((uint)zExp < 0x7ffd) goto LAB_00d05bfb;
  if ((0x7ffd < zExp) ||
     ((((zExp == 0x7ffd && (zSig0 == 0x1ffffffffffff)) && (zSig1 == 0xffffffffffffffff)) &&
      (bVar6 != 0)))) {
    status->float_exception_flags = status->float_exception_flags | 0x28;
    if ((((cVar1 == '\x03') || (zSign != '\0' && cVar1 == '\x02')) || (cVar1 == '\x05')) ||
       (cVar1 == '\x01' && zSign == '\0')) {
      uVar4 = (ulong)zSign << 0x3f | 0x7ffeffffffffffff;
      zSig1 = 0xffffffffffffffff;
    }
    else {
      uVar4 = (ulong)zSign << 0x3f | 0x7fff000000000000;
      zSig1 = 0;
    }
    goto LAB_00d05c4e;
  }
  if (-1 < zExp) goto LAB_00d05bfb;
  if (status->flush_to_zero != '\0') {
    status->float_exception_flags = status->float_exception_flags | 0x80;
    uVar4 = (ulong)zSign << 0x3f;
    zSig1 = 0;
    goto LAB_00d05c4e;
  }
  bVar7 = true;
  if (((zExp == -1) && (status->float_detect_tininess != '\x01')) && (bVar6 != 0)) {
    bVar7 = zSig1 != 0xffffffffffffffff && zSig0 == 0x1ffffffffffff || zSig0 < 0x1ffffffffffff;
  }
  bVar6 = (byte)zExp;
  bVar3 = -bVar6;
  if (zExp < -0x3f) {
    uVar5 = zSig1;
    uVar2 = zSig0;
    if (zExp != -0x40) {
      zSig2 = zSig2 | zSig1;
      if (zExp < -0x7f) {
        uVar5 = (ulong)(zSig0 != 0);
        if (zExp == -0x80) {
          uVar5 = zSig0;
        }
        zSig0 = 0;
        uVar2 = 0;
        goto LAB_00d05d3c;
      }
      uVar5 = zSig0 << (bVar6 & 0x3f);
      uVar2 = zSig0 >> (bVar3 & 0x3f);
    }
    zSig0 = 0;
  }
  else {
    uVar5 = zSig1 << (bVar6 & 0x3f);
    uVar4 = zSig0 << (bVar6 & 0x3f);
    zSig0 = zSig0 >> (bVar3 & 0x3f);
    uVar2 = zSig1 >> (bVar3 & 0x3f) | uVar4;
  }
LAB_00d05d3c:
  zSig2 = zSig2 != 0 | uVar5;
  if ((bool)(bVar7 & zSig2 != 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x10;
  }
  uVar4 = 0;
  zSig1 = uVar2;
  switch(cVar1) {
  case '\0':
  case '\x04':
    bVar6 = (byte)(uVar5 >> 0x3f);
    goto LAB_00d05bfb;
  case '\x01':
    bVar7 = zSign != '\0';
    break;
  case '\x02':
    bVar7 = zSign == '\0';
    break;
  case '\x03':
    bVar6 = 0;
    goto LAB_00d05bfb;
  case '\x05':
    bVar7 = (uVar2 & 1) == 0;
    break;
  default:
switchD_00d05b5c_default:
    abort();
  }
  bVar6 = bVar7 & zSig2 != 0;
LAB_00d05bfb:
  if (zSig2 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  if (bVar6 == 0) {
    if (zSig1 == 0 && zSig0 == 0) {
      uVar4 = 0;
    }
  }
  else {
    zSig0 = zSig0 + (0xfffffffffffffffe < zSig1);
    zSig1 = zSig1 + 1 & ~(ulong)((zSig2 & 0x7fffffffffffffff) == 0 && cVar1 == '\0');
  }
  uVar4 = (uVar4 << 0x30) + ((ulong)zSign << 0x3f) + zSig0;
LAB_00d05c4e:
  fVar8.high = uVar4;
  fVar8.low = zSig1;
  return fVar8;
}

Assistant:

static float128 roundAndPackFloat128(flag zSign, int32_t zExp,
                                     uint64_t zSig0, uint64_t zSig1,
                                     uint64_t zSig2, float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig2 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig2;
        break;
    case float_round_down:
        increment = zSign && zSig2;
        break;
    case float_round_to_odd:
        increment = !(zSig1 & 0x1) && zSig2;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) zExp ) {
        if (    ( 0x7FFD < zExp )
             || (    ( zExp == 0x7FFD )
                  && eq128(
                         UINT64_C(0x0001FFFFFFFFFFFF),
                         UINT64_C(0xFFFFFFFFFFFFFFFF),
                         zSig0,
                         zSig1
                     )
                  && increment
                )
           ) {
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
                 || (roundingMode == float_round_to_odd)
               ) {
                return
                    packFloat128(
                        zSign,
                        0x7FFE,
                        UINT64_C(0x0000FFFFFFFFFFFF),
                        UINT64_C(0xFFFFFFFFFFFFFFFF)
                    );
            }
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat128(zSign, 0, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ! increment
                || lt128(
                       zSig0,
                       zSig1,
                       UINT64_C(0x0001FFFFFFFFFFFF),
                       UINT64_C(0xFFFFFFFFFFFFFFFF)
                   );
            shift128ExtraRightJamming(
                zSig0, zSig1, zSig2, - zExp, &zSig0, &zSig1, &zSig2 );
            zExp = 0;
            if (isTiny && zSig2) {
                float_raise(float_flag_underflow, status);
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig2 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig2;
                break;
            case float_round_down:
                increment = zSign && zSig2;
                break;
            case float_round_to_odd:
                increment = !(zSig1 & 0x1) && zSig2;
                break;
            default:
                abort();
            }
        }
    }
    if (zSig2) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        add128( zSig0, zSig1, 0, 1, &zSig0, &zSig1 );
        zSig1 &= ~ ( ( zSig2 + zSig2 == 0 ) & roundNearestEven );
    }
    else {
        if ( ( zSig0 | zSig1 ) == 0 ) zExp = 0;
    }
    return packFloat128( zSign, zExp, zSig0, zSig1 );

}